

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgCoreOneDimensional.hpp
# Opt level: O2

int __thiscall TasGrid::CustomTabulated::getNumPoints(CustomTabulated *this,int level)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"number of points",&local_39);
  checkLevel(this,level,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (this->num_nodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[level];
}

Assistant:

int getNumPoints(int level) const{ checkLevel(level, "number of points"); return num_nodes[level]; }